

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O2

UDate icu_63::parseDate(UChar *text,UErrorCode *status)

{
  int32_t iVar1;
  ulong uVar2;
  int iVar3;
  int32_t year;
  UErrorCode UVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  UDate UVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  iVar1 = u_strlen_63(text);
  if ((iVar1 == 10) || (iVar1 == 0x10)) {
    UVar4 = *status;
    uVar2 = 0;
    year = 0;
    while ((uVar2 < 4 && (UVar4 < U_ILLEGAL_ARGUMENT_ERROR))) {
      iVar6 = (ushort)text[uVar2] - 0x30;
      if (9 < (ushort)((ushort)text[uVar2] - 0x30)) {
        iVar6 = -1;
      }
      if (iVar6 < 0) {
        *status = U_INVALID_FORMAT_ERROR;
        UVar4 = U_INVALID_FORMAT_ERROR;
      }
      else {
        year = iVar6 + year * 10;
      }
      uVar2 = uVar2 + 1;
    }
    iVar6 = 0;
    uVar2 = 5;
    while ((uVar2 < 7 && (UVar4 < U_ILLEGAL_ARGUMENT_ERROR))) {
      iVar5 = (ushort)text[uVar2] - 0x30;
      if (9 < (ushort)iVar5) {
        iVar5 = -1;
      }
      if (iVar5 < 0) {
        *status = U_INVALID_FORMAT_ERROR;
        UVar4 = U_INVALID_FORMAT_ERROR;
      }
      else {
        iVar6 = iVar5 + iVar6 * 10;
      }
      uVar2 = uVar2 + 1;
    }
    iVar5 = 0;
    uVar2 = 8;
    while ((uVar2 < 10 && (UVar4 < U_ILLEGAL_ARGUMENT_ERROR))) {
      iVar7 = (ushort)text[uVar2] - 0x30;
      if (9 < (ushort)iVar7) {
        iVar7 = -1;
      }
      if (iVar7 < 0) {
        *status = U_INVALID_FORMAT_ERROR;
        UVar4 = U_INVALID_FORMAT_ERROR;
      }
      else {
        iVar5 = iVar7 + iVar5 * 10;
      }
      uVar2 = uVar2 + 1;
    }
    UVar9 = 0.0;
    if (iVar1 == 0x10) {
      iVar7 = 0;
      uVar2 = 0xb;
      while ((uVar2 < 0xd && (UVar4 < U_ILLEGAL_ARGUMENT_ERROR))) {
        iVar8 = (ushort)text[uVar2] - 0x30;
        if (9 < (ushort)iVar8) {
          iVar8 = -1;
        }
        if (iVar8 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          UVar4 = U_INVALID_FORMAT_ERROR;
        }
        else {
          iVar7 = iVar8 + iVar7 * 10;
        }
        uVar2 = uVar2 + 1;
      }
      iVar8 = 0;
      uVar2 = 0xe;
      while ((uVar2 < 0x10 && (UVar4 < U_ILLEGAL_ARGUMENT_ERROR))) {
        iVar3 = (ushort)text[uVar2] - 0x30;
        if (9 < (ushort)iVar3) {
          iVar3 = -1;
        }
        if (iVar3 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          UVar4 = U_INVALID_FORMAT_ERROR;
        }
        else {
          iVar8 = iVar3 + iVar8 * 10;
        }
        uVar2 = uVar2 + 1;
      }
      dVar11 = (double)(iVar7 * 3600000);
      dVar12 = (double)(iVar8 * 60000);
    }
    else {
      dVar11 = 0.0;
      dVar12 = 0.0;
    }
    if (UVar4 < U_ILLEGAL_ARGUMENT_ERROR) {
      dVar10 = Grego::fieldsToDay(year,iVar6 + -1,iVar5);
      UVar9 = dVar10 * 86400000.0 + dVar11 + dVar12;
    }
  }
  else {
    *status = U_INVALID_FORMAT_ERROR;
    UVar9 = 0.0;
  }
  return UVar9;
}

Assistant:

static UDate
parseDate (const UChar *text, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t len = u_strlen(text);
    if (len != 16 && len != 10) {
        // It must be yyyy-MM-dd HH:mm (length 16) or yyyy-MM-dd (length 10)
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }

    int32_t year = 0, month = 0, day = 0, hour = 0, min = 0, n;
    int32_t idx;

    // "yyyy" (0 - 3)
    for (idx = 0; idx <= 3 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            year = 10*year + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "MM" (5 - 6)
    for (idx = 5; idx <= 6 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            month = 10*month + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "dd" (8 - 9)
    for (idx = 8; idx <= 9 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            day = 10*day + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    if (len == 16) {
        // "HH" (11 - 12)
        for (idx = 11; idx <= 12 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                hour = 10*hour + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
        // "mm" (14 - 15)
        for (idx = 14; idx <= 15 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                min = 10*min + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
    }

    if (U_SUCCESS(status)) {
        UDate date = Grego::fieldsToDay(year, month - 1, day) * U_MILLIS_PER_DAY
            + hour * U_MILLIS_PER_HOUR + min * U_MILLIS_PER_MINUTE;
        return date;
    }
    return 0;
}